

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void SerializeMany<VectorWriter,int,unsigned_long,long,unsigned_long,ParamsWrapper<CAddress::SerParams,CService_const>>
               (VectorWriter *s,int *args,unsigned_long *args_1,long *args_2,unsigned_long *args_3,
               ParamsWrapper<CAddress::SerParams,_const_CService> *args_4)

{
  long lVar1;
  VectorWriter *in_R9;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Serialize<VectorWriter>(in_R9,0);
  Serialize<VectorWriter>(in_R9,0x895a06);
  Serialize<VectorWriter>(in_R9,0x895a18);
  Serialize<VectorWriter>(in_R9,0x895a2a);
  Serialize<VectorWriter,_ParamsWrapper<CAddress::SerParams,_const_CService>_>
            (in_R9,(ParamsWrapper<CAddress::SerParams,_const_CService> *)0x895a38);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeMany(Stream& s, const Args&... args)
{
    (::Serialize(s, args), ...);
}